

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Results-ANN-IRIS-Training.cpp
# Opt level: O0

int main(void)

{
  byte bVar1;
  bool bVar2;
  Scalar *pSVar3;
  ostream *poVar4;
  double dVar5;
  double dVar6;
  MatrixXd accuracy;
  MatrixXd prediction;
  int pick;
  int i_1;
  int i;
  MatrixXd validate_y;
  MatrixXd validate_X;
  double learning_rate;
  uniform_int_distribution<int> distribution;
  default_random_engine generator;
  MatrixXd batch_y;
  MatrixXd batch_X;
  int batch_size;
  int index;
  int token;
  size_t pos;
  int line_index;
  string line;
  MatrixXd y;
  MatrixXd X;
  string delimiter;
  ifstream file;
  ANN n;
  int in_stack_fffffffffffff878;
  int in_stack_fffffffffffff87c;
  ANN *in_stack_fffffffffffff880;
  double in_stack_fffffffffffff888;
  ostream *in_stack_fffffffffffff890;
  ostream *in_stack_fffffffffffff898;
  DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *in_stack_fffffffffffff8a0;
  allocator<char> *in_stack_fffffffffffff8b0;
  undefined4 in_stack_fffffffffffff8b8;
  undefined4 in_stack_fffffffffffff8bc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff8c0;
  istream *in_stack_fffffffffffff900;
  undefined7 in_stack_fffffffffffff908;
  ANN *this;
  int in_stack_fffffffffffff93c;
  ANN *in_stack_fffffffffffff940;
  MatrixXd *in_stack_fffffffffffff948;
  ANN *in_stack_fffffffffffff950;
  MatrixXd *in_stack_fffffffffffff968;
  MatrixXd *in_stack_fffffffffffff970;
  int local_510;
  int local_50c;
  double local_478;
  string local_3f8 [32];
  string local_3d8 [32];
  string local_3b8 [32];
  int local_398;
  int local_394;
  long local_390;
  int local_384;
  string local_380 [135];
  allocator<char> local_2f9;
  string local_2f8 [32];
  istream local_2d8 [527];
  allocator<char> local_c9;
  string local_c8 [39];
  allocator<char> local_a1;
  string local_a0 [39];
  allocator<char> local_79;
  string local_78 [48];
  ANN local_48;
  int local_4;
  
  local_4 = 0;
  this = &local_48;
  ANN::ANN(in_stack_fffffffffffff880);
  ANN::setInputSize(this,4);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff8c0,
             (char *)CONCAT44(in_stack_fffffffffffff8bc,in_stack_fffffffffffff8b8),
             in_stack_fffffffffffff8b0);
  ANN::addLayer(in_stack_fffffffffffff940,in_stack_fffffffffffff93c,(string *)this);
  std::__cxx11::string::~string(local_78);
  std::allocator<char>::~allocator(&local_79);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff8c0,
             (char *)CONCAT44(in_stack_fffffffffffff8bc,in_stack_fffffffffffff8b8),
             in_stack_fffffffffffff8b0);
  ANN::addLayer(in_stack_fffffffffffff940,in_stack_fffffffffffff93c,(string *)this);
  std::__cxx11::string::~string(local_a0);
  std::allocator<char>::~allocator(&local_a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff8c0,
             (char *)CONCAT44(in_stack_fffffffffffff8bc,in_stack_fffffffffffff8b8),
             in_stack_fffffffffffff8b0);
  ANN::addLayer(in_stack_fffffffffffff940,in_stack_fffffffffffff93c,(string *)this);
  std::__cxx11::string::~string(local_c8);
  std::allocator<char>::~allocator(&local_c9);
  std::ifstream::ifstream(local_2d8,"/home/haukur/MasterProject/Plotting/iris.csv",8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff8c0,
             (char *)CONCAT44(in_stack_fffffffffffff8bc,in_stack_fffffffffffff8b8),
             in_stack_fffffffffffff8b0);
  std::allocator<char>::~allocator(&local_2f9);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::Zero
            ((Index)in_stack_fffffffffffff888,(Index)in_stack_fffffffffffff880);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
            ((Matrix<double,__1,__1,_0,__1,__1> *)in_stack_fffffffffffff880,
             (EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
              *)CONCAT44(in_stack_fffffffffffff87c,in_stack_fffffffffffff878));
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::Zero
            ((Index)in_stack_fffffffffffff888,(Index)in_stack_fffffffffffff880);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
            ((Matrix<double,__1,__1,_0,__1,__1> *)in_stack_fffffffffffff880,
             (EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
              *)CONCAT44(in_stack_fffffffffffff87c,in_stack_fffffffffffff878));
  bVar1 = std::ifstream::is_open();
  if ((bVar1 & 1) != 0) {
    std::__cxx11::string::string(local_380);
    local_384 = 0;
    while( true ) {
      in_stack_fffffffffffff900 =
           std::getline<char,std::char_traits<char>,std::allocator<char>>(local_2d8,local_380);
      bVar2 = std::ios::operator_cast_to_bool
                        ((ios *)(in_stack_fffffffffffff900 +
                                *(long *)(*(long *)in_stack_fffffffffffff900 + -0x18)));
      if (!bVar2) break;
      local_390 = 0;
      local_398 = -1;
      while (local_390 = std::__cxx11::string::find(local_380,(ulong)local_2f8), local_390 != -1) {
        std::__cxx11::string::substr((ulong)local_3b8,(ulong)local_380);
        dVar6 = std::__cxx11::stod((string *)in_stack_fffffffffffff880,
                                   (size_t *)
                                   CONCAT44(in_stack_fffffffffffff87c,in_stack_fffffffffffff878));
        local_394 = (int)dVar6;
        std::__cxx11::string::~string(local_3b8);
        if (local_398 == -1) {
          pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                             (in_stack_fffffffffffff8a0,(Index)in_stack_fffffffffffff898,
                              (Index)in_stack_fffffffffffff890);
          *pSVar3 = 1.0;
        }
        else {
          std::__cxx11::string::substr((ulong)local_3d8,(ulong)local_380);
          dVar6 = std::__cxx11::stod((string *)in_stack_fffffffffffff880,
                                     (size_t *)
                                     CONCAT44(in_stack_fffffffffffff87c,in_stack_fffffffffffff878));
          std::__cxx11::string::substr((ulong)local_3f8,(ulong)local_380);
          dVar5 = std::__cxx11::stod((string *)in_stack_fffffffffffff880,
                                     (size_t *)
                                     CONCAT44(in_stack_fffffffffffff87c,in_stack_fffffffffffff878));
          pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                             (in_stack_fffffffffffff8a0,(Index)in_stack_fffffffffffff898,
                              (Index)in_stack_fffffffffffff890);
          *pSVar3 = dVar6 + dVar5 / 10.0;
          std::__cxx11::string::~string(local_3f8);
          std::__cxx11::string::~string(local_3d8);
        }
        std::__cxx11::string::length();
        std::__cxx11::string::erase((ulong)local_380,0);
        local_398 = local_398 + 1;
      }
      local_384 = local_384 + 1;
      local_390 = 0xffffffffffffffff;
    }
    std::__cxx11::string::~string(local_380);
  }
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::Zero
            ((Index)in_stack_fffffffffffff888,(Index)in_stack_fffffffffffff880);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
            ((Matrix<double,__1,__1,_0,__1,__1> *)in_stack_fffffffffffff880,
             (EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
              *)CONCAT44(in_stack_fffffffffffff87c,in_stack_fffffffffffff878));
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::Zero
            ((Index)in_stack_fffffffffffff888,(Index)in_stack_fffffffffffff880);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
            ((Matrix<double,__1,__1,_0,__1,__1> *)in_stack_fffffffffffff880,
             (EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
              *)CONCAT44(in_stack_fffffffffffff87c,in_stack_fffffffffffff878));
  std::linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>::
  linear_congruential_engine
            ((linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *)0x1430e0);
  std::uniform_int_distribution<int>::uniform_int_distribution
            ((uniform_int_distribution<int> *)in_stack_fffffffffffff880,in_stack_fffffffffffff87c,
             in_stack_fffffffffffff878);
  local_478 = 0.1;
  Eigen::DenseBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::block<30,4>
            ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)in_stack_fffffffffffff898,
             (Index)in_stack_fffffffffffff890,(Index)in_stack_fffffffffffff888);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::
  Matrix<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,30,4,false>>
            ((Matrix<double,__1,__1,_0,__1,__1> *)in_stack_fffffffffffff880,
             (EigenBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_30,_4,_false>_> *)
             CONCAT44(in_stack_fffffffffffff87c,in_stack_fffffffffffff878));
  Eigen::DenseBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::block<30,3>
            ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)in_stack_fffffffffffff898,
             (Index)in_stack_fffffffffffff890,(Index)in_stack_fffffffffffff888);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::
  Matrix<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,30,3,false>>
            ((Matrix<double,__1,__1,_0,__1,__1> *)in_stack_fffffffffffff880,
             (EigenBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_30,_3,_false>_> *)
             CONCAT44(in_stack_fffffffffffff87c,in_stack_fffffffffffff878));
  for (local_50c = 0; local_50c < 1000; local_50c = local_50c + 1) {
    for (local_510 = 0; local_510 < 0x14; local_510 = local_510 + 1) {
      std::uniform_int_distribution<int>::operator()
                ((uniform_int_distribution<int> *)in_stack_fffffffffffff880,
                 (linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *)
                 CONCAT44(in_stack_fffffffffffff87c,in_stack_fffffffffffff878));
      Eigen::DenseBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::block<1,4>
                ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)in_stack_fffffffffffff898,
                 (Index)in_stack_fffffffffffff890,(Index)in_stack_fffffffffffff888);
      Eigen::DenseBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::block<1,4>
                ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)in_stack_fffffffffffff898,
                 (Index)in_stack_fffffffffffff890,(Index)in_stack_fffffffffffff888);
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_4,_false>::operator=
                ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,_4,_false> *)
                 in_stack_fffffffffffff880,
                 (Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,_4,_false> *)
                 CONCAT44(in_stack_fffffffffffff87c,in_stack_fffffffffffff878));
      Eigen::DenseBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::block<1,3>
                ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)in_stack_fffffffffffff898,
                 (Index)in_stack_fffffffffffff890,(Index)in_stack_fffffffffffff888);
      Eigen::DenseBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::block<1,3>
                ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)in_stack_fffffffffffff898,
                 (Index)in_stack_fffffffffffff890,(Index)in_stack_fffffffffffff888);
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_3,_false>::operator=
                ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,_3,_false> *)
                 in_stack_fffffffffffff880,
                 (Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,_3,_false> *)
                 CONCAT44(in_stack_fffffffffffff87c,in_stack_fffffffffffff878));
    }
    ANN::setLearningRate(&local_48,local_478);
    Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::Matrix
              ((Matrix<double,__1,__1,_0,__1,__1> *)in_stack_fffffffffffff880,
               (Matrix<double,__1,__1,_0,__1,__1> *)
               CONCAT44(in_stack_fffffffffffff87c,in_stack_fffffffffffff878));
    Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::Matrix
              ((Matrix<double,__1,__1,_0,__1,__1> *)in_stack_fffffffffffff880,
               (Matrix<double,__1,__1,_0,__1,__1> *)
               CONCAT44(in_stack_fffffffffffff87c,in_stack_fffffffffffff878));
    ANN::fit(in_stack_fffffffffffff950,in_stack_fffffffffffff948,
             (MatrixXd *)in_stack_fffffffffffff940);
    Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)0x143381)
    ;
    Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)0x14338e)
    ;
    if (local_50c % 1 == 0) {
      Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::Matrix
                ((Matrix<double,__1,__1,_0,__1,__1> *)in_stack_fffffffffffff880,
                 (Matrix<double,__1,__1,_0,__1,__1> *)
                 CONCAT44(in_stack_fffffffffffff87c,in_stack_fffffffffffff878));
      ANN::predict((ANN *)CONCAT17(bVar1,in_stack_fffffffffffff908),
                   (MatrixXd *)in_stack_fffffffffffff900);
      Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix
                ((Matrix<double,__1,__1,_0,__1,__1> *)0x1433e9);
      Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::Matrix
                ((Matrix<double,__1,__1,_0,__1,__1> *)in_stack_fffffffffffff880,
                 (Matrix<double,__1,__1,_0,__1,__1> *)
                 CONCAT44(in_stack_fffffffffffff87c,in_stack_fffffffffffff878));
      ANN::predict((ANN *)CONCAT17(bVar1,in_stack_fffffffffffff908),
                   (MatrixXd *)in_stack_fffffffffffff900);
      Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix
                ((Matrix<double,__1,__1,_0,__1,__1> *)0x14342c);
      poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_50c);
      poVar4 = std::operator<<(poVar4,",");
      Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::Matrix
                ((Matrix<double,__1,__1,_0,__1,__1> *)in_stack_fffffffffffff880,
                 (Matrix<double,__1,__1,_0,__1,__1> *)
                 CONCAT44(in_stack_fffffffffffff87c,in_stack_fffffffffffff878));
      Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::Matrix
                ((Matrix<double,__1,__1,_0,__1,__1> *)in_stack_fffffffffffff880,
                 (Matrix<double,__1,__1,_0,__1,__1> *)
                 CONCAT44(in_stack_fffffffffffff87c,in_stack_fffffffffffff878));
      dVar6 = comparePrediction(in_stack_fffffffffffff970,in_stack_fffffffffffff968);
      in_stack_fffffffffffff898 = (ostream *)std::ostream::operator<<(poVar4,dVar6);
      in_stack_fffffffffffff890 = std::operator<<(in_stack_fffffffffffff898,",");
      Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::Matrix
                ((Matrix<double,__1,__1,_0,__1,__1> *)in_stack_fffffffffffff880,
                 (Matrix<double,__1,__1,_0,__1,__1> *)
                 CONCAT44(in_stack_fffffffffffff87c,in_stack_fffffffffffff878));
      Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::Matrix
                ((Matrix<double,__1,__1,_0,__1,__1> *)in_stack_fffffffffffff880,
                 (Matrix<double,__1,__1,_0,__1,__1> *)
                 CONCAT44(in_stack_fffffffffffff87c,in_stack_fffffffffffff878));
      in_stack_fffffffffffff888 =
           comparePrediction(in_stack_fffffffffffff970,in_stack_fffffffffffff968);
      in_stack_fffffffffffff880 =
           (ANN *)std::ostream::operator<<(in_stack_fffffffffffff890,in_stack_fffffffffffff888);
      std::ostream::operator<<
                ((ostream *)in_stack_fffffffffffff880,std::endl<char,std::char_traits<char>>);
      Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix
                ((Matrix<double,__1,__1,_0,__1,__1> *)0x14355a);
      Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix
                ((Matrix<double,__1,__1,_0,__1,__1> *)0x143567);
      Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix
                ((Matrix<double,__1,__1,_0,__1,__1> *)0x143574);
      Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix
                ((Matrix<double,__1,__1,_0,__1,__1> *)0x143581);
      Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix
                ((Matrix<double,__1,__1,_0,__1,__1> *)0x14358e);
      Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix
                ((Matrix<double,__1,__1,_0,__1,__1> *)0x14359b);
    }
    if (0.01 < local_478) {
      local_478 = local_478 * 0.99;
    }
  }
  local_4 = 0;
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)0x143771);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)0x14377e);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)0x14378b);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)0x143798);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)0x1437a5);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)0x1437b2);
  std::__cxx11::string::~string(local_2f8);
  std::ifstream::~ifstream(local_2d8);
  ANN::~ANN(in_stack_fffffffffffff880);
  return local_4;
}

Assistant:

int main() 
{
    ANN n = ANN();
    n.setInputSize(4);
    n.addLayer(50, "tanh");
    n.addLayer(50, "tanh");
    n.addLayer(3, "sigmoid");

    ifstream file("/home/haukur/MasterProject/Plotting/iris.csv");
    string delimiter = ",";

    Eigen::MatrixXd X = Eigen::MatrixXd::Zero(150, 4);
    Eigen::MatrixXd y = Eigen::MatrixXd::Zero(150, 3);

    if(file.is_open()) {
        string line;
        int line_index = 0;
        while(getline(file, line)) {
            size_t pos = 0;
            int token;
            int index = -1;
            while ((pos = line.find(delimiter)) != std::string::npos) {
                token = stod(line.substr(0, pos));
                if(index == -1) {
                    y(line_index, token) = 1;
                }
                else {
                    X(line_index, index) = stod(line.substr(0, 1)) + stod(line.substr(2, 1))/10;
                }
                line.erase(0, pos + delimiter.length());
                index++;
            }
            line_index++;
        }
    }

    int batch_size = 20;

    Eigen::MatrixXd batch_X = Eigen::MatrixXd::Zero(batch_size, 4);
    Eigen::MatrixXd batch_y = Eigen::MatrixXd::Zero(batch_size, 3);

    std::default_random_engine generator;
    std::uniform_int_distribution<int> distribution(0,119);
    
    double learning_rate = 0.1;

    Eigen::MatrixXd validate_X = X.block<30,4>(120,0);
    Eigen::MatrixXd validate_y = y.block<30,3>(120,0);

    for(int i = 0; i < 1000; i++) {
        for(int i = 0; i < batch_size; i++) {
            int pick = distribution(generator);
            batch_X.block<1,4>(i, 0) = X.block<1,4>(pick, 0);
            batch_y.block<1,3>(i,0) = y.block<1,3>(pick, 0);
        }
        n.setLearningRate(learning_rate);
        n.fit(batch_X, batch_y);
        if(i % 1 == 0) {
            Eigen::MatrixXd prediction = n.predict(validate_X);
            Eigen::MatrixXd accuracy = n.predict(batch_X);
            cout << i << "," << comparePrediction(accuracy, batch_y) << "," << comparePrediction(prediction, validate_y) << endl;
            // Eigen::MatrixXd se = (y - n.predict(X)).array().pow(2);
            // cout << "Epoch: " << i << " MSE: " << se.mean() << " learning rate: " << learning_rate << endl;
        }
        if(learning_rate > 0.01)
            learning_rate *= 0.99;
    }
    
    return 0;
}